

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidyReportDoctype(TidyDoc tdoc)

{
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    prvTidyReportMarkupVersion((TidyDocImpl *)tdoc);
    return 0;
  }
  return -0x16;
}

Assistant:

int TIDY_CALL        tidyReportDoctype( TidyDoc tdoc )
{
    int iret = -EINVAL;
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl ) {
      tidyDocReportDoctype( impl );
      iret = 0;
    }
    return iret;
}